

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_pvrtc1_4.cpp
# Opt level: O0

uint64_t __thiscall
basisu::pvrtc4_image::local_endpoint_optimization_opaque
          (pvrtc4_image *this,uint32_t bx,uint32_t by,image *orig_img,bool perceptual)

{
  byte bVar1;
  byte *pbVar2;
  float *pfVar3;
  pvrtc4_block *ppVar4;
  uint8_t *puVar5;
  uint64_t uVar6;
  unsigned_long uVar7;
  long lVar8;
  pvrtc4_block *ppVar9;
  uint64_t uVar10;
  byte in_R8B;
  float fVar11;
  float fVar12;
  uint32_t block_y_3;
  uint32_t block_x_3;
  int x_5;
  int y_5;
  uint32_t block_y_2;
  uint32_t block_x_2;
  int x_4;
  int y_4;
  uint64_t e03_err_1;
  uint32_t block_y_1;
  uint32_t block_x_1;
  int x_3;
  int y_3;
  pvrtc4_block blocks0 [3] [3];
  uint64_t e03_err_0;
  color_rgba h1;
  color_rgba l1;
  uint32_t block_y;
  uint32_t block_x;
  int x_2;
  int y_2;
  pvrtc4_block cur_blocks [3] [3];
  color_rgba color_1;
  color_rgba color_0;
  vec4F colors [2];
  float weight;
  uint32_t c_1;
  vec3F color;
  color_rgba *orig_c;
  uint32_t px_1;
  uint32_t x_1;
  uint32_t py_1;
  int y_1;
  vec3F new_colors [2];
  uint32_t pass;
  bool success;
  float total_weight [2];
  vec3F quant_colors [2];
  color_rgba *c;
  uint32_t px;
  uint32_t x;
  uint32_t py;
  int y;
  vec3F c_avg_orig;
  uint64_t initial_error;
  vec<3U,_float> *other;
  undefined4 in_stack_fffffffffffffcd0;
  float in_stack_fffffffffffffcd4;
  vec<3U,_float> *in_stack_fffffffffffffcd8;
  uint64_t uVar13;
  image *in_stack_fffffffffffffce0;
  undefined8 in_stack_fffffffffffffce8;
  undefined1 opaque_endpoint;
  color_rgba *in_stack_fffffffffffffcf0;
  uint32_t *puVar14;
  undefined8 in_stack_fffffffffffffcf8;
  uint32_t endpoint_index;
  pvrtc4_block *in_stack_fffffffffffffd00;
  undefined2 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0a;
  uint8_t uVar15;
  undefined1 in_stack_fffffffffffffd0b;
  uint8_t uVar16;
  undefined1 in_stack_fffffffffffffd0c;
  uint8_t uVar17;
  undefined1 in_stack_fffffffffffffd0d;
  uint8_t uVar18;
  undefined1 in_stack_fffffffffffffd0e;
  uint8_t alpha_is_significant;
  undefined1 in_stack_fffffffffffffd0f;
  uint8_t perceptual_00;
  image *in_stack_fffffffffffffd10;
  pvrtc4_image *in_stack_fffffffffffffd18;
  pvrtc4_image *this_00;
  undefined2 in_stack_fffffffffffffd20;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  uint8_t uVar24;
  uint64_t in_stack_fffffffffffffd30;
  pvrtc4_image *threshold_error;
  pvrtc4_block *local_2a8;
  vec<3U,_float> *local_280;
  int local_258;
  int local_254;
  int local_248;
  int local_244;
  int local_230;
  int local_22c;
  pvrtc4_image local_228;
  undefined1 auStack_1e0 [8];
  uint64_t local_1d8;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  pvrtc4_block local_1b8 [9];
  pvrtc4_block apStack_170 [3];
  vec<4U,_float> local_154;
  vec<4U,_float> local_138;
  vec<4U,_float> local_128;
  vec<4U,_float> vStack_118;
  vec<3U,_float> local_108;
  vec<3U,_float> local_fc;
  vec<3U,_float> local_f0;
  float local_e4;
  uint local_e0;
  vec<3U,_float> local_dc;
  color_rgba *local_d0;
  int local_c8;
  uint local_c4;
  int local_c0;
  int local_bc;
  vec<3U,_float> local_b8 [2];
  uint local_a0;
  byte local_99;
  float local_98 [2];
  vec<3U,_float> local_90;
  vec<3U,_float> local_84;
  vec<3U,_float> local_78;
  vec<3U,_float> vStack_6c;
  undefined1 auStack_60 [20];
  int local_4c;
  uint local_48;
  int local_44;
  int local_40;
  vec<3U,_float> local_3c;
  uint64_t local_30;
  byte local_21;
  uint64_t local_8;
  
  local_21 = in_R8B & 1;
  other = (vec<3U,_float> *)0x0;
  local_30 = evaluate_1x1_endpoint_error
                       (in_stack_fffffffffffffd18,
                        (uint32_t)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                        (uint32_t)in_stack_fffffffffffffd10,
                        (image *)CONCAT17(in_stack_fffffffffffffd0f,
                                          CONCAT16(in_stack_fffffffffffffd0e,
                                                   CONCAT15(in_stack_fffffffffffffd0d,
                                                            CONCAT14(in_stack_fffffffffffffd0c,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffd0b,
                                                  CONCAT12(in_stack_fffffffffffffd0a,
                                                           in_stack_fffffffffffffd08)))))),
                        SUB81((ulong)in_stack_fffffffffffffd00 >> 0x38,0),
                        SUB81((ulong)in_stack_fffffffffffffd00 >> 0x30,0),in_stack_fffffffffffffd30)
  ;
  local_8 = local_30;
  if (local_30 != 0) {
    vec<3U,_float>::vec((vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (float)((ulong)other >> 0x20));
    for (local_40 = 0; local_40 < 7; local_40 = local_40 + 1) {
      local_44 = wrap_y((pvrtc4_image *)
                        CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (int)((ulong)other >> 0x20));
      for (local_48 = 0; local_48 < 7; local_48 = local_48 + 1) {
        local_4c = wrap_x((pvrtc4_image *)
                          CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                          (int)((ulong)other >> 0x20));
        auStack_60._8_8_ =
             image::operator()(in_stack_fffffffffffffce0,
                               (uint32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                               (uint32_t)in_stack_fffffffffffffcd8);
        pbVar2 = color_rgba::operator[]
                           ((color_rgba *)
                            CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                            (uint32_t)((ulong)other >> 0x20));
        bVar1 = *pbVar2;
        pfVar3 = vec<3U,_float>::operator[]
                           ((vec<3U,_float> *)
                            CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                            (uint32_t)((ulong)other >> 0x20));
        *pfVar3 = (float)bVar1 + *pfVar3;
        pbVar2 = color_rgba::operator[]
                           ((color_rgba *)
                            CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                            (uint32_t)((ulong)other >> 0x20));
        bVar1 = *pbVar2;
        pfVar3 = vec<3U,_float>::operator[]
                           ((vec<3U,_float> *)
                            CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                            (uint32_t)((ulong)other >> 0x20));
        *pfVar3 = (float)bVar1 + *pfVar3;
        pbVar2 = color_rgba::operator[]
                           ((color_rgba *)
                            CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                            (uint32_t)((ulong)other >> 0x20));
        bVar1 = *pbVar2;
        pfVar3 = vec<3U,_float>::operator[]
                           ((vec<3U,_float> *)
                            CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                            (uint32_t)((ulong)other >> 0x20));
        *pfVar3 = (float)bVar1 + *pfVar3;
      }
    }
    vec<3U,_float>::operator*=(&local_3c,0.020408163);
    local_280 = &local_78;
    do {
      vec<3U,_float>::vec(local_280);
      local_280 = local_280 + 1;
    } while (local_280 != (vec<3U,_float> *)auStack_60);
    vec<3u,float>::set<3u,float>
              (in_stack_fffffffffffffcd8,
               (vec<3U,_float> *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
    vec<3U,_float>::vec((vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (float)((ulong)other >> 0x20));
    vec<3U,_float>::operator-=(&local_78,&local_84);
    vec<3u,float>::set<3u,float>
              (in_stack_fffffffffffffcd8,
               (vec<3U,_float> *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
    vec<3U,_float>::vec((vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (float)((ulong)other >> 0x20));
    vec<3U,_float>::operator+=(&vStack_6c,&local_90);
    local_99 = 1;
    for (local_a0 = 0; local_a0 < 4; local_a0 = local_a0 + 1) {
      vec<3U,_float>::vec((vec<3U,_float> *)
                          CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                          (float)((ulong)other >> 0x20));
      vec<3U,_float>::vec((vec<3U,_float> *)
                          CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                          (float)((ulong)other >> 0x20));
      memset(local_98,0,8);
      for (local_bc = 0; local_bc < 7; local_bc = local_bc + 1) {
        local_c0 = wrap_y((pvrtc4_image *)
                          CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                          (int)((ulong)other >> 0x20));
        for (local_c4 = 0; local_c4 < 7; local_c4 = local_c4 + 1) {
          local_c8 = wrap_x((pvrtc4_image *)
                            CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                            (int)((ulong)other >> 0x20));
          local_d0 = image::operator()(in_stack_fffffffffffffce0,
                                       (uint32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                                       (uint32_t)in_stack_fffffffffffffcd8);
          color_rgba::operator[]
                    ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                     (uint32_t)((ulong)other >> 0x20));
          color_rgba::operator[]
                    ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                     (uint32_t)((ulong)other >> 0x20));
          color_rgba::operator[]
                    ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                     (uint32_t)((ulong)other >> 0x20));
          vec<3U,_float>::vec((vec<3U,_float> *)
                              CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                              (float)((ulong)other >> 0x20),SUB84(other,0),0.0);
          fVar11 = vec<3U,_float>::squared_distance(&local_78,&local_dc);
          fVar12 = vec<3U,_float>::squared_distance(&vStack_6c,&local_dc);
          local_e0 = (uint)(fVar12 < fVar11);
          local_e4 = local_endpoint_optimization_opaque::s_weights[local_bc][local_c4];
          operator*(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4);
          vec<3U,_float>::operator+=(local_b8 + local_e0,&local_f0);
          local_98[local_e0] = local_e4 + local_98[local_e0];
        }
      }
      if (((local_98[0] == 0.0) && (!NAN(local_98[0]))) ||
         ((local_98[1] == 0.0 && (!NAN(local_98[1]))))) {
        local_99 = 0;
      }
      operator/(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4);
      vec<3U,_float>::operator=(&local_78,&local_fc);
      operator/(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4);
      vec<3U,_float>::operator=(&vStack_6c,&local_108);
    }
    if ((local_99 & 1) == 0) {
      vec<3U,_float>::operator=(&local_78,&local_3c);
      vec<3U,_float>::operator=(&vStack_6c,&local_3c);
    }
    vec<4u,float>::vec<3u,float>
              ((vec<4U,_float> *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),other
              );
    vec<4u,float>::vec<3u,float>
              ((vec<4U,_float> *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),other
              );
    vec<3U,_float>::vec((vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (float)((ulong)other >> 0x20));
    vec<4u,float>::vec<3u,float>
              ((vec<4U,_float> *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),other
              );
    vec<4U,_float>::operator+=(&local_128,&local_138);
    vec<3U,_float>::vec((vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (float)((ulong)other >> 0x20));
    vec<4u,float>::vec<3u,float>
              ((vec<4U,_float> *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),other
              );
    vec<4U,_float>::operator+=(&vStack_118,&local_154);
    vec<4U,_float>::operator[]
              ((vec<4U,_float> *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               (uint32_t)((ulong)other >> 0x20));
    vec<4U,_float>::operator[]
              ((vec<4U,_float> *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               (uint32_t)((ulong)other >> 0x20));
    vec<4U,_float>::operator[]
              ((vec<4U,_float> *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               (uint32_t)((ulong)other >> 0x20));
    color_rgba::color_rgba
              ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               (int)((ulong)other >> 0x20),(int)other,0,0x521ed4);
    vec<4U,_float>::operator[]
              ((vec<4U,_float> *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               (uint32_t)((ulong)other >> 0x20));
    vec<4U,_float>::operator[]
              ((vec<4U,_float> *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               (uint32_t)((ulong)other >> 0x20));
    vec<4U,_float>::operator[]
              ((vec<4U,_float> *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               (uint32_t)((ulong)other >> 0x20));
    color_rgba::color_rgba
              ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               (int)((ulong)other >> 0x20),(int)other,0,0x521f4b);
    local_2a8 = local_1b8;
    do {
      pvrtc4_block::pvrtc4_block(local_2a8);
      local_2a8 = local_2a8 + 1;
    } while (local_2a8 != apStack_170);
    for (local_1bc = -1; local_1bc < 2; local_1bc = local_1bc + 1) {
      for (local_1c0 = -1; local_1c0 < 2; local_1c0 = local_1c0 + 1) {
        local_1c4 = wrap_block_x((pvrtc4_image *)
                                 CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                                 (int)((ulong)other >> 0x20));
        local_1c8 = wrap_block_y((pvrtc4_image *)
                                 CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                                 (int)((ulong)other >> 0x20));
        ppVar4 = vector2D<basisu::pvrtc4_block>::operator()
                           ((vector2D<basisu::pvrtc4_block> *)in_stack_fffffffffffffce0,
                            (uint32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                            (uint32_t)in_stack_fffffffffffffcd8);
        local_1b8[(long)(local_1c0 + 1) * 3 + (long)(local_1bc + 1)] = *ppVar4;
      }
    }
    color_rgba::color_rgba
              ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               (int)((ulong)other >> 0x20));
    color_rgba::color_rgba
              ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               (int)((ulong)other >> 0x20));
    pbVar2 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    uVar19 = g_pvrtc_5_nearest[*pbVar2];
    puVar5 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    *puVar5 = uVar19;
    pbVar2 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    uVar20 = g_pvrtc_5_nearest[*pbVar2];
    puVar5 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    *puVar5 = uVar20;
    pbVar2 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    uVar21 = g_pvrtc_5_nearest[*pbVar2];
    puVar5 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    *puVar5 = uVar21;
    pbVar2 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    uVar22 = g_pvrtc_5_nearest[*pbVar2];
    puVar5 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    *puVar5 = uVar22;
    pbVar2 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    uVar23 = g_pvrtc_4_nearest[*pbVar2];
    puVar5 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    *puVar5 = uVar23;
    pbVar2 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    uVar24 = g_pvrtc_5_nearest[*pbVar2];
    puVar5 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    *puVar5 = uVar24;
    puVar5 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    *puVar5 = '\0';
    puVar5 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    *puVar5 = '\0';
    vector2D<basisu::pvrtc4_block>::operator()
              ((vector2D<basisu::pvrtc4_block> *)in_stack_fffffffffffffce0,
               (uint32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
               (uint32_t)in_stack_fffffffffffffcd8);
    pvrtc4_block::set_endpoint_raw
              (in_stack_fffffffffffffd00,(uint32_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
               in_stack_fffffffffffffcf0,SUB81((ulong)in_stack_fffffffffffffce8 >> 0x38,0));
    vector2D<basisu::pvrtc4_block>::operator()
              ((vector2D<basisu::pvrtc4_block> *)in_stack_fffffffffffffce0,
               (uint32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
               (uint32_t)in_stack_fffffffffffffcd8);
    pvrtc4_block::set_endpoint_raw
              (in_stack_fffffffffffffd00,(uint32_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
               in_stack_fffffffffffffcf0,SUB81((ulong)in_stack_fffffffffffffce8 >> 0x38,0));
    local_1d8 = remap_pixels_influenced_by_endpoint
                          ((pvrtc4_image *)
                           CONCAT17(uVar24,CONCAT16(uVar23,CONCAT15(uVar22,CONCAT14(uVar21,CONCAT13(
                                                  uVar20,CONCAT12(uVar19,in_stack_fffffffffffffd20))
                                                  )))),
                           (uint32_t)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                           (uint32_t)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                           (bool)in_stack_fffffffffffffd0f,(bool)in_stack_fffffffffffffd0e);
    threshold_error = &local_228;
    do {
      this_00 = threshold_error;
      pvrtc4_block::pvrtc4_block((pvrtc4_block *)this_00);
      threshold_error = (pvrtc4_image *)&this_00->m_blocks;
    } while (threshold_error != (pvrtc4_image *)auStack_1e0);
    local_22c = -1;
    while( true ) {
      endpoint_index = (uint32_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
      opaque_endpoint = (undefined1)((ulong)in_stack_fffffffffffffce8 >> 0x38);
      if (1 < local_22c) break;
      for (local_230 = -1; local_230 < 2; local_230 = local_230 + 1) {
        wrap_block_x((pvrtc4_image *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                     (int)((ulong)other >> 0x20));
        wrap_block_y((pvrtc4_image *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                     (int)((ulong)other >> 0x20));
        ppVar4 = vector2D<basisu::pvrtc4_block>::operator()
                           ((vector2D<basisu::pvrtc4_block> *)in_stack_fffffffffffffce0,
                            (uint32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                            (uint32_t)in_stack_fffffffffffffcd8);
        *(pvrtc4_block *)
         (&local_228.m_width + (long)(local_230 + 1) * 6 + (long)(local_22c + 1) * 2) = *ppVar4;
      }
      local_22c = local_22c + 1;
    }
    pbVar2 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    uVar15 = g_pvrtc_5_nearest[*pbVar2];
    puVar5 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    *puVar5 = uVar15;
    pbVar2 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    uVar16 = g_pvrtc_5_nearest[*pbVar2];
    puVar5 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    *puVar5 = uVar16;
    pbVar2 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    uVar17 = g_pvrtc_5_nearest[*pbVar2];
    puVar5 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    *puVar5 = uVar17;
    pbVar2 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    uVar18 = g_pvrtc_5_nearest[*pbVar2];
    puVar5 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    *puVar5 = uVar18;
    pbVar2 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    alpha_is_significant = g_pvrtc_4_nearest[*pbVar2];
    puVar5 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    *puVar5 = alpha_is_significant;
    pbVar2 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    perceptual_00 = g_pvrtc_5_nearest[*pbVar2];
    puVar5 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    *puVar5 = perceptual_00;
    puVar5 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    *puVar5 = '\0';
    puVar5 = color_rgba::operator[]
                       ((color_rgba *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        (uint32_t)((ulong)other >> 0x20));
    *puVar5 = '\0';
    vector2D<basisu::pvrtc4_block>::operator()
              ((vector2D<basisu::pvrtc4_block> *)in_stack_fffffffffffffce0,
               (uint32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
               (uint32_t)in_stack_fffffffffffffcd8);
    pvrtc4_block::set_endpoint_raw
              (in_stack_fffffffffffffd00,endpoint_index,in_stack_fffffffffffffcf0,
               (bool)opaque_endpoint);
    vector2D<basisu::pvrtc4_block>::operator()
              ((vector2D<basisu::pvrtc4_block> *)in_stack_fffffffffffffce0,
               (uint32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
               (uint32_t)in_stack_fffffffffffffcd8);
    pvrtc4_block::set_endpoint_raw
              (in_stack_fffffffffffffd00,endpoint_index,in_stack_fffffffffffffcf0,
               (bool)opaque_endpoint);
    uVar6 = remap_pixels_influenced_by_endpoint
                      ((pvrtc4_image *)
                       CONCAT17(uVar24,CONCAT16(uVar23,CONCAT15(uVar22,CONCAT14(uVar21,CONCAT13(
                                                  uVar20,CONCAT12(uVar19,in_stack_fffffffffffffd20))
                                                  )))),(uint32_t)((ulong)this_00 >> 0x20),
                       (uint32_t)this_00,in_stack_fffffffffffffd10,(bool)perceptual_00,
                       (bool)alpha_is_significant);
    uVar10 = local_30;
    uVar7 = minimum<unsigned_long>(local_1d8,uVar6);
    if (uVar10 < uVar7) {
      for (local_244 = -1; local_244 < 2; local_244 = local_244 + 1) {
        for (local_248 = -1; local_248 < 2; local_248 = local_248 + 1) {
          wrap_block_x((pvrtc4_image *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)
                       ,(int)((ulong)other >> 0x20));
          wrap_block_y((pvrtc4_image *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)
                       ,(int)((ulong)other >> 0x20));
          ppVar4 = local_1b8 + (long)(local_248 + 1) * 3;
          lVar8 = (long)(local_244 + 1);
          ppVar9 = vector2D<basisu::pvrtc4_block>::operator()
                             ((vector2D<basisu::pvrtc4_block> *)in_stack_fffffffffffffce0,
                              (uint32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                              (uint32_t)in_stack_fffffffffffffcd8);
          *ppVar9 = ppVar4[lVar8];
        }
      }
      local_8 = local_30;
    }
    else if (local_1d8 < uVar6) {
      for (local_254 = -1; local_254 < 2; local_254 = local_254 + 1) {
        for (local_258 = -1; local_258 < 2; local_258 = local_258 + 1) {
          wrap_block_x((pvrtc4_image *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)
                       ,(int)((ulong)other >> 0x20));
          wrap_block_y((pvrtc4_image *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)
                       ,(int)((ulong)other >> 0x20));
          puVar14 = &local_228.m_width + (long)(local_258 + 1) * 6;
          lVar8 = (long)(local_254 + 1);
          ppVar4 = vector2D<basisu::pvrtc4_block>::operator()
                             ((vector2D<basisu::pvrtc4_block> *)in_stack_fffffffffffffce0,
                              (uint32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                              (uint32_t)in_stack_fffffffffffffcd8);
          *ppVar4 = *(pvrtc4_block *)(puVar14 + lVar8 * 2);
        }
      }
      uVar6 = local_1d8;
      uVar10 = evaluate_1x1_endpoint_error
                         (this_00,(uint32_t)(uVar10 >> 0x20),(uint32_t)uVar10,
                          (image *)CONCAT17(perceptual_00,
                                            CONCAT16(alpha_is_significant,
                                                     CONCAT15(uVar18,CONCAT14(uVar17,CONCAT13(uVar16
                                                  ,CONCAT12(uVar15,in_stack_fffffffffffffd08)))))),
                          SUB81((ulong)in_stack_fffffffffffffd00 >> 0x38,0),
                          SUB81((ulong)in_stack_fffffffffffffd00 >> 0x30,0),
                          (uint64_t)threshold_error);
      if (uVar6 != uVar10) {
        __assert_fail("e03_err_0 == evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_pvrtc1_4.cpp"
                      ,0x22c,
                      "uint64_t basisu::pvrtc4_image::local_endpoint_optimization_opaque(uint32_t, uint32_t, const image &, bool)"
                     );
      }
      local_8 = local_1d8;
    }
    else {
      uVar13 = uVar6;
      uVar10 = evaluate_1x1_endpoint_error
                         (this_00,(uint32_t)(uVar10 >> 0x20),(uint32_t)uVar10,
                          (image *)CONCAT17(perceptual_00,
                                            CONCAT16(alpha_is_significant,
                                                     CONCAT15(uVar18,CONCAT14(uVar17,CONCAT13(uVar16
                                                  ,CONCAT12(uVar15,in_stack_fffffffffffffd08)))))),
                          SUB81((ulong)in_stack_fffffffffffffd00 >> 0x38,0),
                          SUB81((ulong)in_stack_fffffffffffffd00 >> 0x30,0),
                          (uint64_t)threshold_error);
      local_8 = uVar6;
      if (uVar13 != uVar10) {
        __assert_fail("e03_err_1 == evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_pvrtc1_4.cpp"
                      ,0x230,
                      "uint64_t basisu::pvrtc4_image::local_endpoint_optimization_opaque(uint32_t, uint32_t, const image &, bool)"
                     );
      }
    }
  }
  return local_8;
}

Assistant:

uint64_t pvrtc4_image::local_endpoint_optimization_opaque(uint32_t bx, uint32_t by, const image& orig_img, bool perceptual)
	{
		uint64_t initial_error = evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false);
		if (!initial_error)
			return initial_error;

		vec3F c_avg_orig(0);

		for (int y = 0; y < 7; y++)
		{
			const uint32_t py = wrap_y(by * 4 + y - 1);
			for (uint32_t x = 0; x < 7; x++)
			{
				const uint32_t px = wrap_x(bx * 4 + x - 1);

				const color_rgba& c = orig_img(px, py);

				c_avg_orig[0] += c[0];
				c_avg_orig[1] += c[1];
				c_avg_orig[2] += c[2];
			}
		}

		c_avg_orig *= 1.0f / 49.0f;

		vec3F quant_colors[2];
		quant_colors[0].set(c_avg_orig);
		quant_colors[0] -= vec3F(.0125f);

		quant_colors[1].set(c_avg_orig);
		quant_colors[1] += vec3F(.0125f);

		float total_weight[2];

		bool success = true;

		for (uint32_t pass = 0; pass < 4; pass++)
		{
			vec3F new_colors[2] = { vec3F(0), vec3F(0) };
			memset(total_weight, 0, sizeof(total_weight));

			static const float s_weights[7][7] =
			{
				{ 1.000000f, 1.637089f, 2.080362f, 2.242640f, 2.080362f, 1.637089f, 1.000000f },
				{ 1.637089f, 2.414213f, 3.006572f, 3.242640f, 3.006572f, 2.414213f, 1.637089f },
				{ 2.080362f, 3.006572f, 3.828426f, 4.242640f, 3.828426f, 3.006572f, 2.080362f },
				{ 2.242640f, 3.242640f, 4.242640f, 5.000000f, 4.242640f, 3.242640f, 2.242640f },
				{ 2.080362f, 3.006572f, 3.828426f, 4.242640f, 3.828426f, 3.006572f, 2.080362f },
				{ 1.637089f, 2.414213f, 3.006572f, 3.242640f, 3.006572f, 2.414213f, 1.637089f },
				{ 1.000000f, 1.637089f, 2.080362f, 2.242640f, 2.080362f, 1.637089f, 1.000000f }
			};

			for (int y = 0; y < 7; y++)
			{
				const uint32_t py = wrap_y(by * 4 + y - 1);
				for (uint32_t x = 0; x < 7; x++)
				{
					const uint32_t px = wrap_x(bx * 4 + x - 1);

					const color_rgba& orig_c = orig_img(px, py);

					vec3F color(orig_c[0], orig_c[1], orig_c[2]);

					uint32_t c = quant_colors[0].squared_distance(color) > quant_colors[1].squared_distance(color);

					const float weight = s_weights[y][x];
					new_colors[c] += color * weight;

					total_weight[c] += weight;
				}
			}

			if (!total_weight[0] || !total_weight[1])
				success = false;

			quant_colors[0] = new_colors[0] / (float)total_weight[0];
			quant_colors[1] = new_colors[1] / (float)total_weight[1];
		}

		if (!success)
		{
			quant_colors[0] = c_avg_orig;
			quant_colors[1] = c_avg_orig;
		}

		vec4F colors[2] = { quant_colors[0], quant_colors[1] };

		colors[0] += vec3F(.5f);
		colors[1] += vec3F(.5f);
		color_rgba color_0((int)colors[0][0], (int)colors[0][1], (int)colors[0][2], 0);
		color_rgba color_1((int)colors[1][0], (int)colors[1][1], (int)colors[1][2], 0);

		pvrtc4_block cur_blocks[3][3];
		
		for (int y = -1; y <= 1; y++)
		{
			for (int x = -1; x <= 1; x++)
			{
				const uint32_t block_x = wrap_block_x(bx + x);
				const uint32_t block_y = wrap_block_y(by + y);
				cur_blocks[x + 1][y + 1] = m_blocks(block_x, block_y);
			}
		}

		color_rgba l1(0), h1(0);

		l1[0] = g_pvrtc_5_nearest[color_0[0]];
		h1[0] = g_pvrtc_5_nearest[color_1[0]];

		l1[1] = g_pvrtc_5_nearest[color_0[1]];
		h1[1] = g_pvrtc_5_nearest[color_1[1]];

		l1[2] = g_pvrtc_4_nearest[color_0[2]];
		h1[2] = g_pvrtc_5_nearest[color_0[2]];

		l1[3] = 0;
		h1[3] = 0;

		m_blocks(bx, by).set_endpoint_raw(0, l1, true);
		m_blocks(bx, by).set_endpoint_raw(1, h1, true);

		uint64_t e03_err_0 = remap_pixels_influenced_by_endpoint(bx, by, orig_img, perceptual, false);

		pvrtc4_block blocks0[3][3];
		for (int y = -1; y <= 1; y++)
		{
			for (int x = -1; x <= 1; x++)
			{
				const uint32_t block_x = wrap_block_x(bx + x);
				const uint32_t block_y = wrap_block_y(by + y);
				blocks0[x + 1][y + 1] = m_blocks(block_x, block_y);
			}
		}

		l1[0] = g_pvrtc_5_nearest[color_1[0]];
		h1[0] = g_pvrtc_5_nearest[color_0[0]];

		l1[1] = g_pvrtc_5_nearest[color_1[1]];
		h1[1] = g_pvrtc_5_nearest[color_0[1]];

		l1[2] = g_pvrtc_4_nearest[color_1[2]];
		h1[2] = g_pvrtc_5_nearest[color_0[2]];

		l1[3] = 0;
		h1[3] = 0;

		m_blocks(bx, by).set_endpoint_raw(0, l1, true);
		m_blocks(bx, by).set_endpoint_raw(1, h1, true);

		uint64_t e03_err_1 = remap_pixels_influenced_by_endpoint(bx, by, orig_img, perceptual, false);

		if (initial_error < basisu::minimum(e03_err_0, e03_err_1))
		{
			for (int y = -1; y <= 1; y++)
			{
				for (int x = -1; x <= 1; x++)
				{
					const uint32_t block_x = wrap_block_x(bx + x);
					const uint32_t block_y = wrap_block_y(by + y);
					m_blocks(block_x, block_y) = cur_blocks[x + 1][y + 1];
				}
			}
			return initial_error;
		}
		else if (e03_err_0 < e03_err_1)
		{
			for (int y = -1; y <= 1; y++)
			{
				for (int x = -1; x <= 1; x++)
				{
					const uint32_t block_x = wrap_block_x(bx + x);
					const uint32_t block_y = wrap_block_y(by + y);
					m_blocks(block_x, block_y) = blocks0[x + 1][y + 1];
				}
			}
			assert(e03_err_0 == evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false));
			return e03_err_0;
		}

		assert(e03_err_1 == evaluate_1x1_endpoint_error(bx, by, orig_img, perceptual, false));
		return e03_err_1;
	}